

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  code *pcVar1;
  uint newSize;
  Type pDVar2;
  bool bVar3;
  uint uVar4;
  hash_t hVar5;
  undefined4 *puVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  int *local_48;
  int *newBuckets;
  EntryType *pEStack_38;
  int modIndex;
  EntryType *newEntries;
  
  newSize = this->count * 2;
  newBuckets._4_4_ = 0x4b;
  uVar4 = 4;
  if (8 < newSize) {
    uVar4 = this->count & 0x7fffffff;
  }
  uVar4 = PrimePolicy::GetPrime(uVar4,(int *)((long)&newBuckets + 4));
  local_48 = (Type)0x0;
  pEStack_38 = (DictionaryEntry<Js::InternalString,_UnifiedRegex::RegexStats_*> *)0x0;
  if (uVar4 == this->bucketCount) {
    pEStack_38 = AllocateEntries(this,newSize,true);
    Memory::
    CopyArray<JsUtil::DictionaryEntry<Js::InternalString,UnifiedRegex::RegexStats*>,UnifiedRegex::RegexStats*,Memory::ArenaAllocator>
              (pEStack_38,(long)(int)newSize,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = pEStack_38;
    this->size = newSize;
    this->modFunctionIndex = newBuckets._4_4_;
  }
  else {
    Allocate(this,&local_48,&stack0xffffffffffffffc8,uVar4,newSize);
    Memory::
    CopyArray<JsUtil::DictionaryEntry<Js::InternalString,UnifiedRegex::RegexStats*>,UnifiedRegex::RegexStats*,Memory::ArenaAllocator>
              (pEStack_38,(long)(int)newSize,this->entries,(long)this->count);
    this->modFunctionIndex = newBuckets._4_4_;
    if (0 < this->count) {
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      lVar11 = 0;
      do {
        pDVar2 = pEStack_38;
        if (-2 < pEStack_38[lVar11].
                 super_CacheHashedEntry<Js::InternalString,_UnifiedRegex::RegexStats_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<Js::InternalString,_UnifiedRegex::RegexStats_*>.
                 super_ValueEntry<UnifiedRegex::RegexStats_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_UnifiedRegex::RegexStats_*>_>
                 .super_KeyValueEntryDataLayout2<Js::InternalString,_UnifiedRegex::RegexStats_*>.
                 next) {
          uVar7 = (ulong)pEStack_38[lVar11].
                         super_CacheHashedEntry<Js::InternalString,_UnifiedRegex::RegexStats_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                         .super_KeyValueEntry<Js::InternalString,_UnifiedRegex::RegexStats_*>.
                         super_ValueEntry<UnifiedRegex::RegexStats_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_UnifiedRegex::RegexStats_*>_>
                         .
                         super_KeyValueEntryDataLayout2<Js::InternalString,_UnifiedRegex::RegexStats_*>
                         .key.m_charLength;
          if (uVar7 == 0) {
            hVar5 = 0x2393b8b;
          }
          else {
            uVar8 = 0x811c9dc5;
            uVar9 = 0;
            do {
              uVar10 = *(ushort *)
                        ((long)pEStack_38[lVar11].
                               super_CacheHashedEntry<Js::InternalString,_UnifiedRegex::RegexStats_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                               .super_KeyValueEntry<Js::InternalString,_UnifiedRegex::RegexStats_*>.
                               super_ValueEntry<UnifiedRegex::RegexStats_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_UnifiedRegex::RegexStats_*>_>
                               .
                               super_KeyValueEntryDataLayout2<Js::InternalString,_UnifiedRegex::RegexStats_*>
                               .key.m_content.ptr +
                        uVar9 * 2 +
                        (ulong)((uint)pEStack_38[lVar11].
                                      super_CacheHashedEntry<Js::InternalString,_UnifiedRegex::RegexStats_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                      .
                                      super_KeyValueEntry<Js::InternalString,_UnifiedRegex::RegexStats_*>
                                      .
                                      super_ValueEntry<UnifiedRegex::RegexStats_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_UnifiedRegex::RegexStats_*>_>
                                      .
                                      super_KeyValueEntryDataLayout2<Js::InternalString,_UnifiedRegex::RegexStats_*>
                                      .key.m_offset * 2)) ^ uVar8;
              uVar8 = uVar10 * 0x1000193;
              uVar9 = uVar9 + 1;
            } while (uVar7 != uVar9);
            hVar5 = uVar10 * 0x2000326 + 1;
          }
          if (hVar5 != pEStack_38[lVar11].
                       super_CacheHashedEntry<Js::InternalString,_UnifiedRegex::RegexStats_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       .hashCode) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                               ,0xce,
                               "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                               ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar6 = 0;
          }
          hVar5 = PrimePolicy::ModPrime
                            (pDVar2[lVar11].
                             super_CacheHashedEntry<Js::InternalString,_UnifiedRegex::RegexStats_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             .hashCode >> 1,uVar4,this->modFunctionIndex);
          pEStack_38[lVar11].
          super_CacheHashedEntry<Js::InternalString,_UnifiedRegex::RegexStats_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .super_KeyValueEntry<Js::InternalString,_UnifiedRegex::RegexStats_*>.
          super_ValueEntry<UnifiedRegex::RegexStats_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_UnifiedRegex::RegexStats_*>_>
          .super_KeyValueEntryDataLayout2<Js::InternalString,_UnifiedRegex::RegexStats_*>.next =
               local_48[(int)hVar5];
          local_48[(int)hVar5] = (int)lVar11;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < this->count);
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    this->buckets = local_48;
    this->entries = pEStack_38;
    this->bucketCount = uVar4;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }